

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv_udp_open(uv_udp_t *handle,uv_os_sock_t sock)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  
  if ((handle->io_watcher).fd != -1) {
    return -0x10;
  }
  iVar2 = uv__fd_exists(handle->loop,sock);
  iVar3 = -0x11;
  if (iVar2 == 0) {
    iVar3 = uv__nonblock_ioctl(sock,1);
    if (iVar3 == 0) {
      iVar3 = uv__set_reuse(sock);
      if (iVar3 == 0) {
        (handle->io_watcher).fd = sock;
        iVar2 = uv__udp_is_connected(handle);
        iVar3 = 0;
        if (iVar2 != 0) {
          pbVar1 = (byte *)((long)&handle->flags + 3);
          *pbVar1 = *pbVar1 | 2;
          iVar3 = 0;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_udp_open(uv_udp_t* handle, uv_os_sock_t sock) {
  int err;

  /* Check for already active socket. */
  if (handle->io_watcher.fd != -1)
    return UV_EBUSY;

  if (uv__fd_exists(handle->loop, sock))
    return UV_EEXIST;

  err = uv__nonblock(sock, 1);
  if (err)
    return err;

  err = uv__set_reuse(sock);
  if (err)
    return err;

  handle->io_watcher.fd = sock;
  if (uv__udp_is_connected(handle))
    handle->flags |= UV_HANDLE_UDP_CONNECTED;

  return 0;
}